

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

HighsStatus __thiscall
HEkk::initialiseSimplexLpBasisAndFactor(HEkk *this,bool only_from_known_basis)

{
  HighsInt *basic_index;
  uint uVar1;
  HighsSparseMatrix *factor_a_matrix;
  HighsSimplexAnalysis *analysis;
  undefined4 uVar2;
  
  if ((this->status_).has_basis == false) {
    setBasis(this);
  }
  factor_a_matrix = getScaledAMatrixPointer(this);
  basic_index = (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  analysis = &this->analysis_;
  if ((this->status_).has_nla == true) {
    HSimplexNla::setPointers
              (&this->simplex_nla_,&this->lp_,factor_a_matrix,basic_index,this->options_,
               this->timer_,analysis);
    uVar2 = (undefined4)((ulong)analysis >> 0x20);
  }
  else {
    HSimplexNla::setup(&this->simplex_nla_,&this->lp_,basic_index,this->options_,this->timer_,
                       analysis,factor_a_matrix,(this->info_).factor_pivot_threshold);
    uVar2 = (undefined4)((ulong)factor_a_matrix >> 0x20);
    (this->status_).has_nla = true;
  }
  if ((this->status_).has_invert == false) {
    uVar1 = computeFactor(this);
    if (uVar1 != 0) {
      highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                  "HEkk::initialiseSimplexLpBasisAndFactor (%s) Rank_deficiency %d: Id = %d; UpdateCount = %d\n"
                  ,(this->basis_).debug_origin_name._M_dataplus._M_p,(ulong)uVar1,
                  (ulong)(uint)(this->basis_).debug_id,
                  CONCAT44(uVar2,(this->basis_).debug_update_count));
      if (only_from_known_basis) {
        highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kError,
                    "Supposed to be a full-rank basis, but incorrect\n");
        return kError;
      }
      handleRankDeficiency(this);
      invalidateBasis(this);
      setNonbasicMove(this);
      (this->status_).has_basis = true;
      (this->status_).has_invert = true;
      (this->status_).has_fresh_invert = true;
    }
    this->build_synthetic_tick_ = (this->simplex_nla_).build_synthetic_tick_;
    this->total_synthetic_tick_ = 0.0;
  }
  return kOk;
}

Assistant:

HighsStatus HEkk::initialiseSimplexLpBasisAndFactor(
    const bool only_from_known_basis) {
  // This is normally called only from HEkk::initialiseForSolve, with
  // only_from_known_basis = false.
  //
  // In this case, if there is no existing simplex basis then a
  // logical basis is set up. Otherwise the existing simplex basis is
  // factorized, with logicals introduced to handle rank deficiency.
  //
  // It is also called from HighsSolution's
  // formSimplexLpBasisAndFactor, with only_from_known_basis = true or
  // false. In both cases a simplex basis is known.
  //
  // Calls with only_from_known_basis = true originate from
  // Highs::getBasicVariablesInterface, and are made when
  // Highs::getBasicVariables has been called and there is no
  // factorization of the current basis matrix. No rank deficiency
  // handling is permitted so, if it occurs, an error must be
  // returned.
  //
  // Calls with only_from_known_basis = false originate from
  // Highs::setBasis. The simplex basis should be non-singular since
  // it's come from a HighsBasis that is either non-alien, or from an
  // alien HighsBasis that's been checked/completed. However, it's
  // conceivable that a singularity could occur, and it's fine to
  // accommodate it.
  //
  // If only_from_known_basis is true, then there should be a simplex
  // basis to use
  if (only_from_known_basis) assert(status_.has_basis);
  // If there is no simplex basis, set up a logical basis
  if (!status_.has_basis) setBasis();
  // The simplex NLA operates in the scaled space if the LP has
  // scaling factors. If they exist but haven't been applied, then the
  // simplex NLA needs a separate, scaled constraint matrix. Thus
  // getScaledAMatrixPointer() returns a pointer to either the
  // constraint matrix or a scaled copy (that is a member of the HEkk
  // class), with the latter returned if the LP has scaling factors
  // but is unscaled.
  //
  HighsSparseMatrix* local_scaled_a_matrix = getScaledAMatrixPointer();
  //
  // If simplex NLA is set up, pass the pointers that it uses. It
  // deduces any scaling factors that it must use by inspecting
  // whether the LP has scaling factors, and whether it is scaled.
  //
  // If simplex NLA is not set up, then it will be done if
  //
  if (this->status_.has_nla) {
    assert(lpFactorRowCompatible());
    this->simplex_nla_.setPointers(
        &(this->lp_), local_scaled_a_matrix, this->basis_.basicIndex_.data(),
        this->options_, this->timer_, &(this->analysis_));
  } else {
    // todo @ Julian: this fails on glass4
    assert(info_.factor_pivot_threshold >= options_->factor_pivot_threshold);
    simplex_nla_.setup(
        &(this->lp_),                     //&lp_,
        this->basis_.basicIndex_.data(),  // basis_.basicIndex_.data(),
        this->options_,                   // options_,
        this->timer_,                     // timer_,
        &(this->analysis_),               //&analysis_,
        local_scaled_a_matrix, this->info_.factor_pivot_threshold);
    status_.has_nla = true;
  }

  if (!status_.has_invert) {
    const HighsInt rank_deficiency = computeFactor();
    if (rank_deficiency) {
      // Basis is rank deficient
      highsLogDev(
          options_->log_options, HighsLogType::kInfo,
          "HEkk::initialiseSimplexLpBasisAndFactor (%s) Rank_deficiency %d: Id "
          "= "
          "%d; UpdateCount = %d\n",
          basis_.debug_origin_name.c_str(), (int)rank_deficiency,
          (int)basis_.debug_id, (int)basis_.debug_update_count);
      if (only_from_known_basis) {
        // If only this basis should be used, then return error
        highsLogDev(options_->log_options, HighsLogType::kError,
                    "Supposed to be a full-rank basis, but incorrect\n");
        return HighsStatus::kError;
      }
      // Account for rank deficiency by correcting nonbasicFlag
      handleRankDeficiency();
      this->updateStatus(LpAction::kNewBasis);
      setNonbasicMove();
      status_.has_basis = true;
      status_.has_invert = true;
      status_.has_fresh_invert = true;
    }
    // Record the synthetic clock for INVERT, and zero it for UPDATE
    resetSyntheticClock();
  }
  assert(status_.has_invert);
  return HighsStatus::kOk;
}